

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NEST.cpp
# Opt level: O3

NESTresult * __thiscall
NEST::NESTcalc::FullCalculation
          (NESTresult *__return_storage_ptr__,NESTcalc *this,INTERACTION_TYPE species,double energy,
          double density,double dfield,double A,double Z,
          vector<double,_std::allocator<double>_> *NRYieldsParam,
          vector<double,_std::allocator<double>_> *NRERWidthsParam,
          vector<double,_std::allocator<double>_> *ERYieldsParam,bool do_times)

{
  pointer pdVar1;
  pointer pdVar2;
  allocator_type local_79;
  YieldResult local_78;
  double local_40;
  double local_38;
  double local_30;
  value_type local_28;
  
  if (density < 1.0) {
    this->fdetector->inGas = true;
  }
  (__return_storage_ptr__->photon_times).super__Vector_base<double,_std::allocator<double>_>._M_impl
  .super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->photon_times).super__Vector_base<double,_std::allocator<double>_>._M_impl
  .super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->photon_times).super__Vector_base<double,_std::allocator<double>_>._M_impl
  .super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_40 = energy;
  local_38 = dfield;
  local_30 = density;
  GetYields(&local_78,this,species,energy,density,dfield,A,Z,NRYieldsParam,ERYieldsParam);
  *(undefined4 *)&(__return_storage_ptr__->yields).ElectricField = local_78.ElectricField._0_4_;
  *(undefined4 *)((long)&(__return_storage_ptr__->yields).ElectricField + 4) =
       local_78.ElectricField._4_4_;
  *(undefined4 *)&(__return_storage_ptr__->yields).DeltaT_Scint = local_78.DeltaT_Scint._0_4_;
  *(undefined4 *)((long)&(__return_storage_ptr__->yields).DeltaT_Scint + 4) =
       local_78.DeltaT_Scint._4_4_;
  (__return_storage_ptr__->yields).ExcitonRatio = local_78.ExcitonRatio;
  (__return_storage_ptr__->yields).Lindhard = local_78.Lindhard;
  (__return_storage_ptr__->yields).PhotonYield = local_78.PhotonYield;
  (__return_storage_ptr__->yields).ElectronYield = local_78.ElectronYield;
  (*this->_vptr_NESTcalc[0xc])
            (SUB84(local_30,0),0,&local_78,this,__return_storage_ptr__,NRERWidthsParam);
  (__return_storage_ptr__->quanta).recombProb = local_78.ExcitonRatio;
  (__return_storage_ptr__->quanta).Variance = local_78.Lindhard;
  *(double *)&__return_storage_ptr__->quanta = local_78.PhotonYield;
  *(double *)&(__return_storage_ptr__->quanta).ions = local_78.ElectronYield;
  if (do_times) {
    GetPhotonTimes((photonstream *)&local_78,this,species,(__return_storage_ptr__->quanta).photons,
                   (__return_storage_ptr__->quanta).excitons,local_38,local_40);
  }
  else {
    local_28 = 0.0;
    std::vector<double,_std::allocator<double>_>::vector
              ((vector<double,_std::allocator<double>_> *)&local_78,
               (long)(__return_storage_ptr__->quanta).photons,&local_28,&local_79);
  }
  pdVar1 = (__return_storage_ptr__->photon_times).
           super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
           _M_start;
  pdVar2 = (__return_storage_ptr__->photon_times).
           super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
           _M_end_of_storage;
  (__return_storage_ptr__->photon_times).super__Vector_base<double,_std::allocator<double>_>._M_impl
  .super__Vector_impl_data._M_start = (pointer)local_78.PhotonYield;
  (__return_storage_ptr__->photon_times).super__Vector_base<double,_std::allocator<double>_>._M_impl
  .super__Vector_impl_data._M_finish = (pointer)local_78.ElectronYield;
  (__return_storage_ptr__->photon_times).super__Vector_base<double,_std::allocator<double>_>._M_impl
  .super__Vector_impl_data._M_end_of_storage = (pointer)local_78.ExcitonRatio;
  local_78.PhotonYield = 0.0;
  local_78.ElectronYield = 0.0;
  local_78.ExcitonRatio = 0.0;
  if (pdVar1 != (pointer)0x0) {
    operator_delete(pdVar1,(long)pdVar2 - (long)pdVar1);
    if ((void *)local_78.PhotonYield != (void *)0x0) {
      operator_delete((void *)local_78.PhotonYield,
                      (long)local_78.ExcitonRatio - (long)local_78.PhotonYield);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

NESTresult NESTcalc::FullCalculation(INTERACTION_TYPE species, double energy,
                                     double density, double dfield, double A,
                                     double Z,
                                     const std::vector<double> &NRYieldsParam,
                                     const std::vector<double> &NRERWidthsParam,
                                     const std::vector<double> &ERYieldsParam,
                                     bool do_times /*=true*/) {
  if (density < 1.) fdetector->set_inGas(true);
  NESTresult result;
  result.yields = GetYields(species, energy, density, dfield, A, Z,
                            NRYieldsParam, ERYieldsParam);
  result.quanta =
      GetQuanta(result.yields, density, NRERWidthsParam, -999.);
  if (do_times)
    result.photon_times = GetPhotonTimes(
        species, result.quanta.photons, result.quanta.excitons, dfield, energy);
  else {
    result.photon_times = photonstream(result.quanta.photons, 0.0);
  }
  return result;
}